

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-table.c
# Opt level: O0

_Bool Curl_uint_tbl_first(uint_tbl *tbl,uint *pkey,void **pentry)

{
  _Bool _Var1;
  void **pentry_local;
  uint *pkey_local;
  uint_tbl *tbl_local;
  
  if ((pkey == (uint *)0x0) || (pentry == (void **)0x0)) {
    tbl_local._7_1_ = false;
  }
  else if ((tbl->nentries == 0) || (_Var1 = uint_tbl_next_at(tbl,0,pkey,pentry), !_Var1)) {
    *pkey = 0xffffffff;
    *pentry = (void *)0x0;
    tbl_local._7_1_ = false;
  }
  else {
    tbl_local._7_1_ = true;
  }
  return tbl_local._7_1_;
}

Assistant:

bool Curl_uint_tbl_first(struct uint_tbl *tbl,
                         unsigned int *pkey, void **pentry)
{
  if(!pkey || !pentry)
    return FALSE;
  if(tbl->nentries && uint_tbl_next_at(tbl, 0, pkey, pentry))
    return TRUE;
  DEBUGASSERT(!tbl->nentries);
  *pkey = UINT_MAX;  /* always invalid */
  *pentry = NULL;
  return FALSE;
}